

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O3

bool ear::insideAngleRange(double x,double start,double end,double tol)

{
  double dVar1;
  double dVar2;
  
  do {
    dVar2 = end;
    end = dVar2 + -360.0;
  } while (start < dVar2 + -360.0);
  for (; dVar2 < start; dVar2 = dVar2 + 360.0) {
  }
  do {
    dVar1 = x;
    x = dVar1 + -360.0;
  } while (start - tol <= dVar1 + -360.0);
  for (; dVar1 < start - tol; dVar1 = dVar1 + 360.0) {
  }
  return dVar1 <= dVar2 + tol;
}

Assistant:

bool insideAngleRange(double x, double start, double end, double tol) {
    // end is clockwise from start; if end is start + 360, this rotation is
    // preserved; this makes sure that a range of (-180, 180) or (0, 360)
    // means any angle, while (-180, -180) or (0, 0) means a single angle,
    // even though -180/180 and 0/360 are nominally the same angle
    while (end - 360.0 > start) {
      end -= 360.0;
    }
    while (end < start) {
      end += 360.0;
    }
    double start_tol = start - tol;
    while (x - 360.0 >= start_tol) {
      x -= 360.0;
    }
    while (x < start_tol) {
      x += 360.0;
    }
    // x is greater than equal to start-tol, so we only need to compare
    // against the end.
    return x <= end + tol;
  }